

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O0

void duckdb::ComputePartitionIndicesFunctor::Operation<2ul>
               (Vector *hashes,Vector *partition_indices,idx_t original_count,
               SelectionVector *append_sel,idx_t append_count)

{
  bool bVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  UnifiedVectorFormat *pUVar4;
  idx_t iVar5;
  sel_t *psVar6;
  SelectionVector *pSVar7;
  SelectionVector *in_RCX;
  UnifiedVectorFormat *in_RSI;
  Vector *in_RDI;
  ulong in_R8;
  Vector *unaff_retaddr;
  sel_t source_idx_1;
  idx_t i_1;
  idx_t source_idx;
  idx_t i;
  unsigned_long *target;
  SelectionVector *source_sel;
  unsigned_long *source_data;
  UnifiedVectorFormat format;
  UnifiedVectorFormat *this;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ulong local_b8;
  ulong local_a8;
  UnifiedVectorFormat local_78;
  ulong local_28;
  SelectionVector *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  bVar1 = SelectionVector::IsSet(in_RCX);
  if ((bVar1) && (VVar2 = Vector::GetVectorType(in_RDI), VVar2 != CONSTANT_VECTOR)) {
    UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40))
    ;
    Vector::ToUnifiedFormat(unaff_retaddr,(idx_t)in_RDI,in_RSI);
    puVar3 = UnifiedVectorFormat::GetData<unsigned_long>(&local_78);
    pUVar4 = (UnifiedVectorFormat *)FlatVector::GetData<unsigned_long>((Vector *)0x5fc67b);
    this = pUVar4;
    bVar1 = SelectionVector::IsSet(local_78.sel);
    if (bVar1) {
      for (local_a8 = 0; local_a8 < local_28; local_a8 = local_a8 + 1) {
        psVar6 = SelectionVector::operator[](local_20,local_a8);
        iVar5 = SelectionVector::get_index(local_78.sel,(ulong)*psVar6);
        pSVar7 = (SelectionVector *)RadixPartitioningConstants<2UL>::ApplyMask(puVar3[iVar5]);
        (&pUVar4->sel)[local_a8] = pSVar7;
      }
    }
    else {
      for (local_b8 = 0; local_b8 < local_28; local_b8 = local_b8 + 1) {
        psVar6 = SelectionVector::operator[](local_20,local_b8);
        pSVar7 = (SelectionVector *)RadixPartitioningConstants<2UL>::ApplyMask(puVar3[*psVar6]);
        (&pUVar4->sel)[local_b8] = pSVar7;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(this);
  }
  else {
    UnaryExecutor::
    Execute<unsigned_long,unsigned_long,duckdb::ComputePartitionIndicesFunctor::Operation<2ul>(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::SelectionVector_const&,unsigned_long)::_lambda(unsigned_long)_1_>
              (in_RDI,in_RSI,local_28,1);
  }
  return;
}

Assistant:

static void Operation(Vector &hashes, Vector &partition_indices, const idx_t original_count,
	                      const SelectionVector &append_sel, const idx_t append_count) {
		using CONSTANTS = RadixPartitioningConstants<radix_bits>;
		if (!append_sel.IsSet() || hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			UnaryExecutor::Execute<hash_t, hash_t>(hashes, partition_indices, append_count,
			                                       [&](hash_t hash) { return CONSTANTS::ApplyMask(hash); });
		} else {
			// We could just slice the "hashes" vector and use the UnaryExecutor
			// But slicing a dictionary vector causes SelectionData to be allocated
			// Instead, we just directly compute the partition indices using the selection vectors
			UnifiedVectorFormat format;
			hashes.ToUnifiedFormat(original_count, format);
			const auto source_data = UnifiedVectorFormat::GetData<hash_t>(format);
			const auto &source_sel = *format.sel;

			const auto target = FlatVector::GetData<hash_t>(partition_indices);

			if (source_sel.IsSet()) {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = source_sel.get_index(append_sel[i]);
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			} else {
				for (idx_t i = 0; i < append_count; i++) {
					const auto source_idx = append_sel[i];
					target[i] = CONSTANTS::ApplyMask(source_data[source_idx]);
				}
			}
		}
	}